

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O3

SRes __thiscall
crnlib::LzmaDec_AllocateProbs2(crnlib *this,CLzmaDec *p,CLzmaProps *propNew,ISzAlloc *alloc)

{
  void *pvVar1;
  uint uVar2;
  
  uVar2 = (0x300 << ((char)p + (char)propNew & 0x1fU)) + 0x736;
  if ((*(void **)(this + 0x10) == (void *)0x0) || (uVar2 != *(uint *)(this + 0x68))) {
    (*alloc->Free)(alloc,*(void **)(this + 0x10));
    *(undefined8 *)(this + 0x10) = 0;
    pvVar1 = (*alloc->Alloc)(alloc,(ulong)uVar2 * 2);
    *(void **)(this + 0x10) = pvVar1;
    *(uint *)(this + 0x68) = uVar2;
    if (pvVar1 == (void *)0x0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec* p, const CLzmaProps* propNew, ISzAlloc* alloc) {
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (p->probs == 0 || numProbs != p->numProbs) {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb*)alloc->Alloc(alloc, numProbs * sizeof(CLzmaProb));
    p->numProbs = numProbs;
    if (p->probs == 0)
      return SZ_ERROR_MEM;
  }
  return SZ_OK;
}